

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimapper.cpp
# Opt level: O2

void __thiscall rtosc::MidiMappernRT::refresh_midi(MidiMappernRT *this)

{
  _Base_ptr p_Var1;
  char buf [1024];
  char acStack_428 [1024];
  
  for (p_Var1 = (this->inv_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->inv_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    rtosc_message(acStack_428,0x400,*(char **)(p_Var1 + 1),"");
    std::function<void_(const_char_*)>::operator()(&this->rt_cb,acStack_428);
  }
  return;
}

Assistant:

void MidiMappernRT::refresh_midi()
{
    for (const auto& entry : inv_map) {
        const char* msg = entry.first.c_str();
        char buf[1024];
        rtosc_message(buf,1024,msg,"");
        rt_cb(buf);
        
    }

}